

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_import_ec_public_key
          (psa_ecc_curve_t curve,uint8_t *data,size_t data_length,mbedtls_ecp_keypair **p_ecp)

{
  int iVar1;
  mbedtls_ecp_keypair *local_38;
  mbedtls_ecp_keypair *ecp;
  mbedtls_ecp_keypair **ppmStack_28;
  psa_status_t status;
  mbedtls_ecp_keypair **p_ecp_local;
  size_t data_length_local;
  uint8_t *data_local;
  psa_ecc_curve_t curve_local;
  
  ecp._4_4_ = 0xffffff69;
  local_38 = (mbedtls_ecp_keypair *)0x0;
  ppmStack_28 = p_ecp;
  p_ecp_local = (mbedtls_ecp_keypair **)data_length;
  data_length_local = (size_t)data;
  data_local._3_1_ = curve;
  ecp._4_4_ = psa_prepare_import_ec_key(curve,data_length,1,&local_38);
  if (ecp._4_4_ == 0) {
    iVar1 = mbedtls_ecp_point_read_binary
                      (&local_38->grp,&local_38->Q,(uchar *)data_length_local,(size_t)p_ecp_local);
    ecp._4_4_ = mbedtls_to_psa_error(iVar1);
    if (ecp._4_4_ == 0) {
      iVar1 = mbedtls_ecp_check_pubkey(&local_38->grp,&local_38->Q);
      ecp._4_4_ = mbedtls_to_psa_error(iVar1);
      if (ecp._4_4_ == 0) {
        *ppmStack_28 = local_38;
        return 0;
      }
    }
  }
  if (local_38 != (mbedtls_ecp_keypair *)0x0) {
    mbedtls_ecp_keypair_free(local_38);
    free(local_38);
  }
  return ecp._4_4_;
}

Assistant:

static psa_status_t psa_import_ec_public_key( psa_ecc_curve_t curve,
                                              const uint8_t *data,
                                              size_t data_length,
                                              mbedtls_ecp_keypair **p_ecp )
{
    psa_status_t status = PSA_ERROR_CORRUPTION_DETECTED;
    mbedtls_ecp_keypair *ecp = NULL;

    status = psa_prepare_import_ec_key( curve, data_length, 1, &ecp );
    if( status != PSA_SUCCESS )
        goto exit;

    /* Load the public value. */
    status = mbedtls_to_psa_error(
        mbedtls_ecp_point_read_binary( &ecp->grp, &ecp->Q,
                                       data, data_length ) );
    if( status != PSA_SUCCESS )
        goto exit;

    /* Check that the point is on the curve. */
    status = mbedtls_to_psa_error(
        mbedtls_ecp_check_pubkey( &ecp->grp, &ecp->Q ) );
    if( status != PSA_SUCCESS )
        goto exit;

    *p_ecp = ecp;
    return( PSA_SUCCESS );

exit:
    if( ecp != NULL )
    {
        mbedtls_ecp_keypair_free( ecp );
        mbedtls_free( ecp );
    }
    return( status );
}